

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ClearWindowSettings(char *name)

{
  byte *pbVar1;
  int iVar2;
  char *pcVar3;
  ImGuiContext *pIVar4;
  ImGuiID IVar5;
  ImGuiWindow *window;
  ImGuiWindowSettings *pIVar6;
  ImGuiWindowSettings *pIVar7;
  ImGuiContext *g;
  
  IVar5 = ImHashStr(name,0,0);
  pIVar4 = GImGui;
  window = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,IVar5);
  if (window == (ImGuiWindow *)0x0) {
    IVar5 = ImHashStr(name,0,0);
    pcVar3 = (pIVar4->SettingsWindows).Buf.Data;
    if (pcVar3 != (char *)0x0) {
      pIVar7 = (ImGuiWindowSettings *)(pcVar3 + 4);
      pIVar6 = pIVar7;
      do {
        if ((pIVar6->ID == IVar5) && (pIVar6->WantDelete != true)) goto LAB_001909a9;
        iVar2._0_1_ = pIVar6[-1].Collapsed;
        iVar2._1_1_ = pIVar6[-1].IsChild;
        iVar2._2_1_ = pIVar6[-1].WantApply;
        iVar2._3_1_ = pIVar6[-1].WantDelete;
        pIVar6 = (ImGuiWindowSettings *)((long)&pIVar6->ID + (long)iVar2);
      } while (pIVar6 != (ImGuiWindowSettings *)
                         ((long)&pIVar7->ID + (long)(pIVar4->SettingsWindows).Buf.Size));
    }
  }
  else {
    pbVar1 = (byte *)((long)&window->Flags + 1);
    *pbVar1 = *pbVar1 | 1;
    InitOrLoadWindowSettings(window,(ImGuiWindowSettings *)0x0);
    pIVar6 = FindWindowSettingsByWindow(window);
    if (pIVar6 != (ImGuiWindowSettings *)0x0) {
LAB_001909a9:
      pIVar6->WantDelete = true;
    }
  }
  return;
}

Assistant:

void ImGui::ClearWindowSettings(const char* name)
{
    //IMGUI_DEBUG_LOG("ClearWindowSettings('%s')\n", name);
    ImGuiWindow* window = FindWindowByName(name);
    if (window != NULL)
    {
        window->Flags |= ImGuiWindowFlags_NoSavedSettings;
        InitOrLoadWindowSettings(window, NULL);
    }
    if (ImGuiWindowSettings* settings = window ? FindWindowSettingsByWindow(window) : FindWindowSettingsByID(ImHashStr(name)))
        settings->WantDelete = true;
}